

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::OrientEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *edges,
               ON_SimpleArray<ON_SubDEdgePtr> *edge_chain)

{
  ulong uVar1;
  uint uVar2;
  uint i;
  ulong uVar3;
  ulong new_capacity;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  new_capacity = (ulong)(uint)edges->m_count;
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828e30;
  local_48.m_a = (ON_SubDEdge **)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  if (new_capacity != 0) {
    ON_SimpleArray<const_ON_SubDEdge_*>::SetCapacity(&local_48,new_capacity);
    uVar3 = 0;
    do {
      uVar1 = edges->m_a[uVar3].m_ptr;
      local_50 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
      if (((uint)uVar1 & 6) != 4) {
        local_50 = (ON_SubDEdge *)0x0;
      }
      ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
      uVar3 = uVar3 + 1;
    } while (new_capacity != uVar3);
  }
  uVar2 = OrientEdgesIntoEdgeChains(&local_48,edge_chain);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& edges,
  ON_SimpleArray< ON_SubDEdgePtr >& edge_chain
)
{
  const unsigned count = edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(edges[i].Edge());
  return ON_SubDEdgeChain::OrientEdgesIntoEdgeChains(a, edge_chain);
}